

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfrule.cpp
# Opt level: O1

int32_t __thiscall
icu_63::NFRule::findText
          (NFRule *this,UnicodeString *str,UnicodeString *key,int32_t startingAt,int32_t *length)

{
  UnicodeString *this_00;
  short sVar1;
  ushort uVar2;
  bool bVar3;
  byte bVar4;
  int32_t iVar5;
  int32_t iVar6;
  undefined4 uVar7;
  int iVar8;
  int32_t iVar9;
  uint start;
  uint uVar10;
  int32_t iVar11;
  int iVar12;
  char16_t *srcChars;
  FieldPosition position;
  UnicodeString suffix;
  UnicodeString prefix;
  Formattable result;
  FieldPosition local_138;
  UnicodeString local_120;
  UnicodeString local_e0;
  Formattable local_a0;
  
  if (this->rulePatternFormat == (PluralFormat *)0x0) {
    iVar8 = (*(this->formatter->super_NumberFormat).super_Format.super_UObject._vptr_UObject[0x19])
                      ();
    if ((char)iVar8 != '\0') {
      iVar9 = findTextLenient(this,str,key,startingAt,length);
      return iVar9;
    }
    sVar1 = (key->fUnion).fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      iVar8 = (key->fUnion).fFields.fLength;
    }
    else {
      iVar8 = (int)sVar1 >> 5;
    }
    *length = iVar8;
    if (startingAt < 0) {
      startingAt = 0;
    }
    else {
      sVar1 = (str->fUnion).fStackFields.fLengthAndFlags;
      if (sVar1 < 0) {
        iVar8 = (str->fUnion).fFields.fLength;
      }
      else {
        iVar8 = (int)sVar1 >> 5;
      }
      if (iVar8 < startingAt) {
        startingAt = iVar8;
      }
    }
    uVar2 = (key->fUnion).fStackFields.fLengthAndFlags;
    sVar1 = (str->fUnion).fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      iVar9 = (str->fUnion).fFields.fLength;
    }
    else {
      iVar9 = (int)sVar1 >> 5;
    }
    if ((uVar2 & 1) != 0) {
      return -1;
    }
    if ((short)uVar2 < 0) {
      iVar5 = (key->fUnion).fFields.fLength;
    }
    else {
      iVar5 = (int)(short)uVar2 >> 5;
    }
    iVar8 = 0;
    if (iVar5 < 0) {
      iVar8 = iVar5;
    }
    iVar12 = iVar5 - iVar8;
    if (iVar5 <= iVar5 - iVar8) {
      iVar12 = iVar5;
    }
    if (iVar5 < 0) {
      iVar12 = 0;
    }
    if (iVar12 < 1) {
      return -1;
    }
    if ((uVar2 & 2) == 0) {
      srcChars = (key->fUnion).fFields.fArray;
    }
    else {
      srcChars = (key->fUnion).fStackFields.fBuffer;
    }
    iVar9 = UnicodeString::indexOf(str,srcChars,iVar8,iVar12,startingAt,iVar9 - startingAt);
    return iVar9;
  }
  Formattable::Formattable(&local_a0);
  local_138.super_UObject._vptr_UObject = (_func_int **)&PTR__FieldPosition_003d69c8;
  local_138.fField = 0;
  local_138.fEndIndex = 0;
  local_138.fBeginIndex = startingAt;
  PluralFormat::parseType(this->rulePatternFormat,str,this,&local_a0,&local_138);
  iVar9 = local_138.fBeginIndex;
  if (-1 < local_138.fBeginIndex) {
    this_00 = &this->fRuleText;
    sVar1 = (this->fRuleText).fUnion.fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      uVar10 = (this->fRuleText).fUnion.fFields.fLength;
    }
    else {
      uVar10 = (int)sVar1 >> 5;
    }
    start = (int)uVar10 >> 0x1f & uVar10;
    iVar5 = UnicodeString::indexOf(this_00,L"$(",0,-1,start,uVar10 - start);
    iVar8 = 0;
    if (-1 < iVar5) {
      sVar1 = (this->fRuleText).fUnion.fStackFields.fLengthAndFlags;
      if (sVar1 < 0) {
        iVar8 = (this->fRuleText).fUnion.fFields.fLength;
      }
      else {
        iVar8 = (int)sVar1 >> 5;
      }
      if (iVar5 <= iVar8) {
        iVar8 = iVar5;
      }
    }
    sVar1 = (this->fRuleText).fUnion.fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      iVar11 = (this->fRuleText).fUnion.fFields.fLength;
    }
    else {
      iVar11 = (int)sVar1 >> 5;
    }
    iVar6 = UnicodeString::indexOf(this_00,L")$",0,-1,iVar8,iVar11 - iVar8);
    iVar11 = local_138.fEndIndex;
    UnicodeString::tempSubString(&local_e0,this_00,0,iVar5);
    UnicodeString::tempSubString(&local_120,this_00,iVar6 + 2,0x7fffffff);
    if ((local_e0.fUnion.fStackFields.fLengthAndFlags & 1U) == 0) {
      uVar7 = local_e0.fUnion.fFields.fLength;
      if (-1 < local_e0.fUnion.fStackFields.fLengthAndFlags) {
        uVar7 = (int)local_e0.fUnion.fStackFields.fLengthAndFlags >> 5;
      }
      iVar8 = 0;
      if ((int)uVar7 < 0) {
        iVar8 = uVar7;
      }
      iVar12 = uVar7 - iVar8;
      if ((int)uVar7 <= uVar7 - iVar8) {
        iVar12 = uVar7;
      }
      if ((int)uVar7 < 0) {
        iVar12 = 0;
      }
      if ((local_e0.fUnion.fStackFields.fLengthAndFlags & 2U) != 0) {
        local_e0.fUnion.fFields.fArray = local_e0.fUnion.fStackFields.fBuffer;
      }
      bVar4 = UnicodeString::doCompare
                        (str,iVar9 - uVar7,uVar7,local_e0.fUnion.fFields.fArray,iVar8,iVar12);
    }
    else {
      bVar4 = ~*(byte *)&str->fUnion & 1;
    }
    bVar3 = true;
    if (bVar4 == 0) {
      if ((local_120.fUnion.fStackFields.fLengthAndFlags & 1U) == 0) {
        uVar7 = local_120.fUnion.fFields.fLength;
        if (-1 < local_120.fUnion.fStackFields.fLengthAndFlags) {
          uVar7 = (int)local_120.fUnion.fStackFields.fLengthAndFlags >> 5;
        }
        iVar8 = 0;
        if ((int)uVar7 < 0) {
          iVar8 = uVar7;
        }
        iVar12 = uVar7 - iVar8;
        if ((int)uVar7 <= uVar7 - iVar8) {
          iVar12 = uVar7;
        }
        if ((int)uVar7 < 0) {
          iVar12 = 0;
        }
        if ((local_120.fUnion.fStackFields.fLengthAndFlags & 2U) != 0) {
          local_120.fUnion.fFields.fArray = local_120.fUnion.fStackFields.fBuffer;
        }
        bVar4 = UnicodeString::doCompare
                          (str,iVar11,uVar7,local_120.fUnion.fFields.fArray,iVar8,iVar12);
      }
      else {
        bVar4 = ~*(byte *)&str->fUnion & 1;
      }
      if (bVar4 == 0) {
        if (-1 < local_e0.fUnion.fStackFields.fLengthAndFlags) {
          local_e0.fUnion.fFields.fLength = (int)local_e0.fUnion.fStackFields.fLengthAndFlags >> 5;
        }
        if (-1 < local_120.fUnion.fStackFields.fLengthAndFlags) {
          local_120.fUnion.fFields.fLength = (int)local_120.fUnion.fStackFields.fLengthAndFlags >> 5
          ;
        }
        *length = (iVar11 - iVar9) + local_e0.fUnion.fFields.fLength +
                  local_120.fUnion.fFields.fLength;
        iVar9 = iVar9 - local_e0.fUnion.fFields.fLength;
        bVar3 = false;
      }
    }
    UnicodeString::~UnicodeString(&local_120);
    UnicodeString::~UnicodeString(&local_e0);
    if (!bVar3) goto LAB_00259373;
  }
  *length = 0;
  iVar9 = -1;
LAB_00259373:
  FieldPosition::~FieldPosition(&local_138);
  Formattable::~Formattable(&local_a0);
  return iVar9;
}

Assistant:

int32_t
NFRule::findText(const UnicodeString& str,
                 const UnicodeString& key,
                 int32_t startingAt,
                 int32_t* length) const
{
    if (rulePatternFormat) {
        Formattable result;
        FieldPosition position(UNUM_INTEGER_FIELD);
        position.setBeginIndex(startingAt);
        rulePatternFormat->parseType(str, this, result, position);
        int start = position.getBeginIndex();
        if (start >= 0) {
            int32_t pluralRuleStart = fRuleText.indexOf(gDollarOpenParenthesis, -1, 0);
            int32_t pluralRuleSuffix = fRuleText.indexOf(gClosedParenthesisDollar, -1, pluralRuleStart) + 2;
            int32_t matchLen = position.getEndIndex() - start;
            UnicodeString prefix(fRuleText.tempSubString(0, pluralRuleStart));
            UnicodeString suffix(fRuleText.tempSubString(pluralRuleSuffix));
            if (str.compare(start - prefix.length(), prefix.length(), prefix, 0, prefix.length()) == 0
                    && str.compare(start + matchLen, suffix.length(), suffix, 0, suffix.length()) == 0)
            {
                *length = matchLen + prefix.length() + suffix.length();
                return start - prefix.length();
            }
        }
        *length = 0;
        return -1;
    }
    if (!formatter->isLenient()) {
        // if lenient parsing is turned off, this is easy: just call
        // String.indexOf() and we're done
        *length = key.length();
        return str.indexOf(key, startingAt);
    }
    else {
        // but if lenient parsing is turned ON, we've got some work
        // ahead of us
        return findTextLenient(str, key, startingAt, length);
    }
}